

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall flatbuffers::Parser::ParseProtoMapField(Parser *this,StructDef *struct_def)

{
  pointer pcVar1;
  size_type sVar2;
  long *plVar3;
  Value *e;
  StructDef *pSVar4;
  string *in_RDX;
  CheckedError *ce;
  int t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> entry_table_name;
  string proto_field_id;
  FieldDef *field;
  FieldDef *key_field;
  StructDef *entry_table;
  string field_name;
  FieldDef *value_field;
  undefined1 local_138 [32];
  StructDef *local_118;
  long local_110;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  StructDef *local_c8;
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  string local_a0;
  FieldDef *local_78;
  undefined2 uStack_70;
  undefined6 uStack_6e;
  undefined2 uStack_68;
  undefined8 uStack_66;
  FieldDef *local_58;
  undefined2 uStack_50;
  undefined6 uStack_4e;
  undefined2 uStack_48;
  undefined8 uStack_46;
  
  Next(this);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    t = (int)struct_def;
    Expect(this,t);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      uStack_48 = 0;
      uStack_46 = 0;
      local_58 = (FieldDef *)0x0;
      uStack_50 = 0;
      uStack_4e = 0;
      ParseType(this,(Type *)struct_def);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        Expect(this,t);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          uStack_68._0_1_ = false;
          uStack_68._1_1_ = 0;
          uStack_66 = 0;
          local_78 = (FieldDef *)0x0;
          uStack_70 = 0;
          uStack_6e = 0;
          ParseType(this,(Type *)struct_def);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            Expect(this,t);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
              sVar2 = (struct_def->super_Definition).file._M_string_length;
              local_c0._M_p = (pointer)&local_b0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_c0,sVar2,
                         (struct_def->super_Definition).file.field_2._M_allocated_capacity + sVar2);
              Next(this);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                Expect(this,t);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                  local_f8._M_allocated_capacity = (size_type)(local_108 + 0x20);
                  sVar2 = (struct_def->super_Definition).file._M_string_length;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)(local_108 + 0x10),sVar2,
                             (struct_def->super_Definition).file.field_2._M_allocated_capacity +
                             sVar2);
                  Expect(this,t);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                    Expect(this,t);
                    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                      ConvertCase((string *)local_138,(string *)&local_c0,kUpperCamel,kSnake);
                      plVar3 = (long *)std::__cxx11::string::append(local_138);
                      local_118 = (StructDef *)local_108;
                      pSVar4 = (StructDef *)(plVar3 + 2);
                      if ((StructDef *)*plVar3 == pSVar4) {
                        local_108._0_8_ = (pSVar4->super_Definition).name._M_dataplus._M_p;
                        local_108._8_8_ = plVar3[3];
                      }
                      else {
                        local_108._0_8_ = (pSVar4->super_Definition).name._M_dataplus._M_p;
                        local_118 = (StructDef *)*plVar3;
                      }
                      local_110 = plVar3[1];
                      *plVar3 = (long)pSVar4;
                      plVar3[1] = 0;
                      *(undefined1 *)(plVar3 + 2) = 0;
                      pcVar1 = local_138 + 0x10;
                      if ((pointer)local_138._0_8_ != pcVar1) {
                        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
                      }
                      StartStruct(this,(string *)struct_def,&local_118);
                      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                        local_c8->has_key = true;
                        local_138._0_8_ = pcVar1;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_138,"key","");
                        AddField(this,struct_def,(string *)local_c8,(Type *)local_138,&local_58);
                        if ((pointer)local_138._0_8_ != pcVar1) {
                          operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
                        }
                        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                          *(undefined1 *)(local_d8._8_8_ + 0x111) = 1;
                          local_138._0_8_ = pcVar1;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_138,"value","");
                          AddField(this,struct_def,(string *)local_c8,(Type *)local_138,&local_78);
                          if ((pointer)local_138._0_8_ != pcVar1) {
                            operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
                          }
                          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                            local_138._24_2_ = 0;
                            local_138._16_8_ = 0;
                            local_138._0_8_ = (pointer)0xf0000000e;
                            local_138._8_8_ = local_c8;
                            AddField(this,struct_def,in_RDX,(Type *)&local_c0,(FieldDef **)local_138
                                    );
                            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                              if (local_f8._8_8_ != 0) {
                                e = (Value *)operator_new(0x48);
                                *(undefined8 *)((long)&(e->type).struct_def + 2) = 0;
                                *(undefined8 *)((long)&(e->type).enum_def + 2) = 0;
                                (e->type).base_type = BASE_TYPE_NONE;
                                (e->type).element = BASE_TYPE_NONE;
                                (e->type).struct_def = (StructDef *)0x0;
                                (e->constant)._M_dataplus._M_p = (pointer)&(e->constant).field_2;
                                *(undefined2 *)&(e->constant).field_2 = 0x30;
                                (e->constant)._M_string_length = 1;
                                e->offset = 0xffff;
                                std::__cxx11::string::_M_assign((string *)&e->constant);
                                local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_a0,"id","");
                                SymbolTable<flatbuffers::Value>::Add
                                          ((SymbolTable<flatbuffers::Value> *)
                                           (local_d8._M_allocated_capacity + 0x58),&local_a0,e);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                                  operator_delete(local_a0._M_dataplus._M_p,
                                                  local_a0.field_2._M_allocated_capacity + 1);
                                }
                              }
                              *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
                            }
                          }
                        }
                      }
                      if (local_118 != (StructDef *)local_108) {
                        operator_delete(local_118,(ulong)(local_108._0_8_ + 1));
                      }
                    }
                  }
                  if ((undefined1 *)local_f8._M_allocated_capacity != local_108 + 0x20) {
                    operator_delete((void *)local_f8._M_allocated_capacity,
                                    (ulong)(local_e8._M_p + 1));
                  }
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_p != &local_b0) {
                operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
              }
            }
          }
        }
      }
    }
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseProtoMapField(StructDef *struct_def) {
  NEXT();
  EXPECT('<');
  Type key_type;
  ECHECK(ParseType(key_type));
  EXPECT(',');
  Type value_type;
  ECHECK(ParseType(value_type));
  EXPECT('>');
  auto field_name = attribute_;
  NEXT();
  EXPECT('=');
  std::string proto_field_id = attribute_;
  EXPECT(kTokenIntegerConstant);
  EXPECT(';');

  auto entry_table_name = ConvertCase(field_name, Case::kUpperCamel) + "Entry";
  StructDef *entry_table;
  ECHECK(StartStruct(entry_table_name, &entry_table));
  entry_table->has_key = true;
  FieldDef *key_field;
  ECHECK(AddField(*entry_table, "key", key_type, &key_field));
  key_field->key = true;
  FieldDef *value_field;
  ECHECK(AddField(*entry_table, "value", value_type, &value_field));

  Type field_type;
  field_type.base_type = BASE_TYPE_VECTOR;
  field_type.element = BASE_TYPE_STRUCT;
  field_type.struct_def = entry_table;
  FieldDef *field;
  ECHECK(AddField(*struct_def, field_name, field_type, &field));
  if (!proto_field_id.empty()) {
    auto val = new Value();
    val->constant = proto_field_id;
    field->attributes.Add("id", val);
  }

  return NoError();
}